

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeWindow(ImGuiWindow *window,char *label)

{
  uint uVar1;
  bool bVar2;
  ImVec4 *col;
  ImDrawList *this;
  char *pcVar3;
  ImGuiColumns *columns;
  char *pcVar4;
  char *pcVar5;
  ImVec2 *lhs;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *local_80;
  uint local_78;
  int local_54;
  int n;
  ImGuiWindowFlags flags;
  byte local_41;
  uint local_40;
  bool open;
  ImGuiTreeNodeFlags tree_node_flags;
  bool is_active;
  ImGuiContext *g;
  char *label_local;
  ImGuiWindow *window_local;
  
  g = (ImGuiContext *)label;
  label_local = (char *)window;
  if (window == (ImGuiWindow *)0x0) {
    BulletText("%s: NULL",label);
  }
  else {
    _tree_node_flags = GImGui;
    open = (bool)(window->WasActive & 1);
    local_40 = (uint)(window == GImGui->NavWindow);
    if (open == false) {
      col = GetStyleColorVec4(1);
      PushStyleColor(0,col);
    }
    pcVar7 = " *Inactive*";
    if ((open & 1U) != 0) {
      pcVar7 = "";
    }
    local_41 = TreeNodeEx(&g->Initialized,local_40,"%s \'%s\'%s",g,*(undefined8 *)label_local,pcVar7
                         );
    if ((open & 1U) == 0) {
      PopStyleColor(1);
    }
    bVar2 = IsItemHovered(0);
    if ((bVar2) && ((open & 1U) != 0)) {
      this = GetForegroundDrawList((ImGuiWindow *)label_local);
      lhs = (ImVec2 *)(label_local + 0x10);
      _n = operator+(lhs,(ImVec2 *)(label_local + 0x18));
      ImDrawList::AddRect(this,lhs,(ImVec2 *)&n,0xff00ffff,0.0,0xf,1.0);
    }
    if ((local_41 & 1) != 0) {
      if ((label_local[0x408] & 1U) != 0) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
      }
      uVar1 = *(uint *)(label_local + 0xc);
      NodeDrawList((ImGuiWindow *)label_local,*(ImDrawList **)(label_local + 0x2d0),"DrawList");
      BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)",
                 (double)*(float *)(label_local + 0x10),(double)*(float *)(label_local + 0x14),
                 (double)*(float *)(label_local + 0x18),(double)*(float *)(label_local + 0x1c),
                 (double)*(float *)(label_local + 0x28),(double)*(float *)(label_local + 0x2c));
      pcVar7 = "";
      if ((uVar1 & 0x1000000) != 0) {
        pcVar7 = "Child ";
      }
      pcVar4 = "";
      if ((uVar1 & 0x2000000) != 0) {
        pcVar4 = "Tooltip ";
      }
      pcVar6 = "";
      if ((uVar1 & 0x4000000) != 0) {
        pcVar6 = "Popup ";
      }
      pcVar8 = "";
      if ((uVar1 & 0x8000000) != 0) {
        pcVar8 = "Modal ";
      }
      pcVar11 = "";
      if ((uVar1 & 0x10000000) != 0) {
        pcVar11 = "ChildMenu ";
      }
      pcVar5 = "";
      if ((uVar1 & 0x100) != 0) {
        pcVar5 = "NoSavedSettings ";
      }
      pcVar10 = "";
      if ((uVar1 & 0x200) != 0) {
        pcVar10 = "NoMouseInputs";
      }
      pcVar9 = "";
      if ((uVar1 & 0x40000) != 0) {
        pcVar9 = "NoNavInputs";
      }
      pcVar3 = "";
      if ((uVar1 & 0x40) != 0) {
        pcVar3 = "AlwaysAutoResize";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar1,pcVar7,pcVar4,pcVar6,pcVar8,
                 pcVar11,pcVar5,pcVar10,pcVar9,pcVar3);
      pcVar7 = " \t";
      if ((label_local[0x84] & 1U) != 0) {
        pcVar7 = "##X";
      }
      pcVar4 = " \t";
      if ((label_local[0x85] & 1U) != 0) {
        pcVar4 = "##Y";
      }
      BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",
                 (double)*(float *)(label_local + 0x54),(double)*(float *)(label_local + 0x5c),
                 (double)*(float *)(label_local + 0x58),(double)*(float *)(label_local + 0x60),
                 pcVar7 + 2,pcVar4 + 2);
      if (((label_local[0x86] & 1U) == 0) && ((label_local[0x87] & 1U) == 0)) {
        local_78 = 0xffffffff;
      }
      else {
        local_78 = (uint)*(short *)(label_local + 0x96);
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)(label_local[0x86] & 1),(ulong)(label_local[0x87] & 1),
                 (ulong)(label_local[0x88] & 1),(ulong)local_78);
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)(label_local[0x8c] & 1),(ulong)(label_local[0x8d] & 1),
                 (ulong)*(uint *)(label_local + 0xa4),(ulong)*(uint *)(label_local + 0xa8),
                 (ulong)(label_local[0x8b] & 1),pcVar11,pcVar5,pcVar10,pcVar9,pcVar3);
      BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",
                 (ulong)*(uint *)(label_local + 0x3e0),(ulong)*(uint *)(label_local + 0x3e4),
                 (ulong)*(uint *)(label_local + 0x148));
      if (*(long *)(label_local + 0x3d8) == 0) {
        local_80 = "NULL";
      }
      else {
        local_80 = (char *)**(undefined8 **)(label_local + 0x3d8);
      }
      BulletText("NavLastChildNavWindow: %s",local_80);
      bVar2 = ImRect::IsInverted((ImRect *)(label_local + 1000));
      if (bVar2) {
        BulletText("NavRectRel[0]: <None>");
      }
      else {
        BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)",(double)*(float *)(label_local + 1000),
                   (double)*(float *)(label_local + 0x3ec),(double)*(float *)(label_local + 0x3f0),
                   (double)*(float *)(label_local + 0x3f4));
      }
      if (*(char **)(label_local + 0x3c0) != label_local) {
        NodeWindow(*(ImGuiWindow **)(label_local + 0x3c0),"RootWindow");
      }
      if (*(long *)(label_local + 0x3b8) != 0) {
        NodeWindow(*(ImGuiWindow **)(label_local + 0x3b8),"ParentWindow");
      }
      if (0 < *(int *)(label_local + 400)) {
        NodeWindows((ImVector<ImGuiWindow_*> *)(label_local + 400),"ChildWindows");
      }
      if ((0 < *(int *)(label_local + 0x2b8)) &&
         (bVar2 = TreeNode("Columns","Columns sets (%d)",(ulong)*(uint *)(label_local + 0x2b8)),
         bVar2)) {
        for (local_54 = 0; local_54 < *(int *)(label_local + 0x2b8); local_54 = local_54 + 1) {
          columns = ImVector<ImGuiColumns>::operator[]
                              ((ImVector<ImGuiColumns> *)(label_local + 0x2b8),local_54);
          NodeColumns(columns);
        }
        TreePop();
      }
      NodeStorage((ImGuiStorage *)(label_local + 0x2a8),"Storage");
      TreePop();
    }
  }
  return;
}

Assistant:

static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (window == NULL)
            {
                ImGui::BulletText("%s: NULL", label);
                return;
            }

            ImGuiContext& g = *GImGui;
            const bool is_active = window->WasActive;
            ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
            if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
            const bool open = ImGui::TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
            if (!is_active) { PopStyleColor(); }
            if (ImGui::IsItemHovered() && is_active)
                ImGui::GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!open)
                return;

            if (window->MemoryCompacted)
                ImGui::TextDisabled("Note: some memory buffers have been compacted/freed.");

            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    NodeColumns(&window->ColumnsStorage[n]);
                ImGui::TreePop();
            }
            NodeStorage(&window->StateStorage, "Storage");
            ImGui::TreePop();
        }